

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkValidatorUtils.hpp
# Opt level: O2

Result * CoreML::validatePooling3dPadding
                   (Result *__return_storage_ptr__,
                   Pooling3DLayerParams_Pooling3DPaddingType paddingType,int padding,
                   string *paddingName)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  string err;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  string local_80;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if (paddingType == Pooling3DLayerParams_Pooling3DPaddingType_CUSTOM) {
    if (-1 < padding) goto LAB_002b4cf4;
    std::operator+(&local_a0,"Custom Padding ",paddingName);
    std::operator+(&local_100,&local_a0," must be non-negative, got ");
    std::__cxx11::to_string(&local_120,padding);
    std::operator+(&local_e0,&local_100,&local_120);
    std::operator+(&err,&local_e0,".");
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_a0);
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
  }
  else {
    if (padding == 0) {
LAB_002b4cf4:
      Result::Result(__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    std::operator+(&local_40,"Custom Padding ",paddingName);
    std::operator+(&local_120,&local_40," cannot be non-zero (got ");
    std::__cxx11::to_string(&local_60,padding);
    std::operator+(&local_a0,&local_120,&local_60);
    std::operator+(&local_100,&local_a0,") unless padding type is CUSTOM (got ");
    std::__cxx11::to_string(&local_80,paddingType);
    std::operator+(&local_e0,&local_100,&local_80);
    std::operator+(&err,&local_e0,").");
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_40);
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
  }
  std::__cxx11::string::~string((string *)&err);
  return __return_storage_ptr__;
}

Assistant:

inline Result validatePooling3dPadding(const Specification::Pooling3DLayerParams_Pooling3DPaddingType paddingType,
                              const int padding, const std::string& paddingName) {
    if (paddingType == Specification::Pooling3DLayerParams_Pooling3DPaddingType_CUSTOM) {
        if (padding < 0) {
            std::string err = "Custom Padding " + paddingName + " must be non-negative, got " + std::to_string(padding) + ".";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    } else {
        if (padding != 0) {
            std::string err = "Custom Padding " + paddingName + " cannot be non-zero (got " + std::to_string(padding)
            + ") unless padding type is CUSTOM (got " + std::to_string(paddingType) + ").";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    }
    Result r;
    return r;
}